

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
* __thiscall
boost::unordered::detail::foa::
table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
::operator++(table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             *this)

{
  uchar uVar1;
  uint uVar2;
  table_element_pointer ppVar3;
  char_pointer puVar4;
  table_element_pointer ppVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  puVar4 = this->pc_;
  lVar8 = 0;
  ppVar3 = this->p_;
LAB_00692c26:
  ppVar5 = ppVar3 + 1;
  if (((int)puVar4 + (int)lVar8 & 0xfU) != 0xe) goto code_r0x00692c38;
  this->p_ = ppVar5;
  this->pc_ = puVar4 + lVar8 + 2;
  puVar4 = puVar4 + lVar8 + 0x12;
  ppVar3 = ppVar3 + 0x10;
  while( true ) {
    auVar9[0] = -(puVar4[-0x10] == '\0');
    auVar9[1] = -(puVar4[-0xf] == '\0');
    auVar9[2] = -(puVar4[-0xe] == '\0');
    auVar9[3] = -(puVar4[-0xd] == '\0');
    auVar9[4] = -(puVar4[-0xc] == '\0');
    auVar9[5] = -(puVar4[-0xb] == '\0');
    auVar9[6] = -(puVar4[-10] == '\0');
    auVar9[7] = -(puVar4[-9] == '\0');
    auVar9[8] = -(puVar4[-8] == '\0');
    auVar9[9] = -(puVar4[-7] == '\0');
    auVar9[10] = -(puVar4[-6] == '\0');
    auVar9[0xb] = -(puVar4[-5] == '\0');
    auVar9[0xc] = -(puVar4[-4] == '\0');
    auVar9[0xd] = -(puVar4[-3] == '\0');
    auVar9[0xe] = -(puVar4[-2] == '\0');
    auVar9[0xf] = -(puVar4[-1] == '\0');
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe);
    if (uVar6 != 0x7fff) break;
    this->pc_ = puVar4;
    this->p_ = ppVar3;
    ppVar3 = ppVar3 + 0xf;
    puVar4 = puVar4 + 0x10;
  }
  uVar6 = uVar6 ^ 0x7fff;
  uVar2 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
    }
  }
  uVar7 = (ulong)uVar2;
  if (puVar4[uVar7 - 0x10] != '\x01') {
    this->pc_ = puVar4 + (uVar7 - 0x10);
    ppVar5 = ppVar3 + (uVar7 - 0xf);
    goto LAB_00692c5b;
  }
  goto LAB_00692cdb;
code_r0x00692c38:
  this->pc_ = puVar4 + lVar8 + 1;
  uVar1 = puVar4[lVar8 + 1];
  lVar8 = lVar8 + 1;
  ppVar3 = ppVar5;
  if (uVar1 != '\0') {
    if (uVar1 == '\x01') {
LAB_00692cdb:
      ppVar5 = (table_element_pointer)0x0;
    }
LAB_00692c5b:
    this->p_ = ppVar5;
    return this;
  }
  goto LAB_00692c26;
}

Assistant:

inline table_iterator& operator++() noexcept {
        increment();
        return *this;
    }